

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void cleanup_utmp(void)

{
  undefined1 local_18 [8];
  timeval tv;
  
  if (pty_stamped_utmp) {
    utmp_entry.ut_type = 8;
    memset(utmp_entry.ut_user,0,0x20);
    gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
    utmp_entry.ut_tv.tv_usec = (__int32_t)tv.tv_sec;
    updwtmpx("/var/log/wtmp",(utmpx *)&utmp_entry);
    memset(utmp_entry.ut_line,0,0x20);
    utmp_entry.ut_tv.tv_sec = 0;
    utmp_entry.ut_tv.tv_usec = 0;
    setutxent();
    pututxline((utmpx *)&utmp_entry);
    endutxent();
    pty_stamped_utmp = false;
  }
  return;
}

Assistant:

static void cleanup_utmp(void)
{
    struct timeval tv;

    if (!pty_stamped_utmp)
        return;

    utmp_entry.ut_type = DEAD_PROCESS;
    memset(utmp_entry.ut_user, 0, lenof(utmp_entry.ut_user));
    gettimeofday(&tv, NULL);
    utmp_entry.ut_tv.tv_sec = tv.tv_sec;
    utmp_entry.ut_tv.tv_usec = tv.tv_usec;

#if HAVE_UPDWTMPX
    updwtmpx(WTMPX_FILE, &utmp_entry);
#endif

    memset(utmp_entry.ut_line, 0, lenof(utmp_entry.ut_line));
    utmp_entry.ut_tv.tv_sec = 0;
    utmp_entry.ut_tv.tv_usec = 0;

    setutxent();
    pututxline(&utmp_entry);
    endutxent();

    pty_stamped_utmp = false;     /* ensure we never double-cleanup */
}